

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int UnixVfs_isfile(char *zPath)

{
  int iVar1;
  stat st;
  stat sStack_98;
  
  iVar1 = stat(zPath,&sStack_98);
  return -(uint)((sStack_98.st_mode & 0xf000) != 0x8000 || iVar1 != 0);
}

Assistant:

static int UnixVfs_isfile(const char *zPath)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){
	 return -1;
	}
	rc = S_ISREG(st.st_mode);
	return rc ? JX9_OK : -1 ;
}